

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O0

bool __thiscall
google::protobuf::SimpleDescriptorDatabase::
DescriptorIndex<const_google::protobuf::FileDescriptorProto_*>::AddSymbol
          (DescriptorIndex<const_google::protobuf::FileDescriptorProto_*> *this,string *name,
          FileDescriptorProto *value)

{
  FileDescriptorProto *sub_symbol;
  bool bVar1;
  LogMessage *pLVar2;
  pointer ppVar3;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*>_>,_bool>
  pVar4;
  bool local_1e9;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*>
  local_170;
  const_iterator local_148;
  LogFinisher local_139;
  LogMessage local_138;
  _Self local_100;
  LogFinisher local_f1;
  LogMessage local_f0;
  _Base_ptr local_b8;
  undefined1 local_b0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*>
  local_a8;
  _Self local_80;
  _Self local_78;
  iterator iter;
  LogMessage local_60;
  FileDescriptorProto *local_28;
  FileDescriptorProto *value_local;
  string *name_local;
  DescriptorIndex<const_google::protobuf::FileDescriptorProto_*> *this_local;
  
  local_28 = value;
  value_local = (FileDescriptorProto *)name;
  name_local = (string *)this;
  bVar1 = ValidateSymbolName(this,name);
  if (bVar1) {
    local_78._M_node = (_Base_ptr)FindLastLessOrEqual(this,(string *)value_local);
    local_80._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*>_>_>
         ::end(&this->by_symbol_);
    bVar1 = std::operator==(&local_78,&local_80);
    if (bVar1) {
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*>
      ::pair<const_google::protobuf::FileDescriptorProto_*&,_true>
                (&local_a8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)value_local,
                 &local_28);
      pVar4 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*>_>_>
              ::insert(&this->by_symbol_,&local_a8);
      local_b8 = (_Base_ptr)pVar4.first._M_node;
      local_b0 = pVar4.second;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*>
      ::~pair(&local_a8);
      this_local._7_1_ = true;
    }
    else {
      ppVar3 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*>_>
               ::operator->(&local_78);
      bVar1 = IsSubSymbol(this,&ppVar3->first,(string *)value_local);
      if (bVar1) {
        internal::LogMessage::LogMessage
                  (&local_f0,LOGLEVEL_ERROR,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/descriptor_database.cc"
                   ,0x6e);
        pLVar2 = internal::LogMessage::operator<<(&local_f0,"Symbol name \"");
        pLVar2 = internal::LogMessage::operator<<(pLVar2,(string *)value_local);
        pLVar2 = internal::LogMessage::operator<<(pLVar2,"\" conflicts with the existing symbol \"")
        ;
        ppVar3 = std::
                 _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*>_>
                 ::operator->(&local_78);
        pLVar2 = internal::LogMessage::operator<<(pLVar2,&ppVar3->first);
        pLVar2 = internal::LogMessage::operator<<(pLVar2,"\".");
        internal::LogFinisher::operator=(&local_f1,pLVar2);
        internal::LogMessage::~LogMessage(&local_f0);
        this_local._7_1_ = false;
      }
      else {
        std::
        _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*>_>
        ::operator++(&local_78);
        local_100._M_node =
             (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*>_>_>
             ::end(&this->by_symbol_);
        bVar1 = std::operator!=(&local_78,&local_100);
        sub_symbol = value_local;
        local_1e9 = false;
        if (bVar1) {
          ppVar3 = std::
                   _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*>_>
                   ::operator->(&local_78);
          local_1e9 = IsSubSymbol(this,(string *)sub_symbol,&ppVar3->first);
        }
        if (local_1e9 == false) {
          std::
          _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*>_>
          ::_Rb_tree_const_iterator(&local_148,&local_78);
          std::
          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*>
          ::pair<const_google::protobuf::FileDescriptorProto_*&,_true>
                    (&local_170,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     value_local,&local_28);
          std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*>_>_>
          ::insert(&this->by_symbol_,local_148,&local_170);
          std::
          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*>
          ::~pair(&local_170);
          this_local._7_1_ = true;
        }
        else {
          internal::LogMessage::LogMessage
                    (&local_138,LOGLEVEL_ERROR,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/descriptor_database.cc"
                     ,0x7b);
          pLVar2 = internal::LogMessage::operator<<(&local_138,"Symbol name \"");
          pLVar2 = internal::LogMessage::operator<<(pLVar2,(string *)value_local);
          pLVar2 = internal::LogMessage::operator<<
                             (pLVar2,"\" conflicts with the existing symbol \"");
          ppVar3 = std::
                   _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*>_>
                   ::operator->(&local_78);
          pLVar2 = internal::LogMessage::operator<<(pLVar2,&ppVar3->first);
          pLVar2 = internal::LogMessage::operator<<(pLVar2,"\".");
          internal::LogFinisher::operator=(&local_139,pLVar2);
          internal::LogMessage::~LogMessage(&local_138);
          this_local._7_1_ = false;
        }
      }
    }
  }
  else {
    internal::LogMessage::LogMessage
              (&local_60,LOGLEVEL_ERROR,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/descriptor_database.cc"
               ,0x5e);
    pLVar2 = internal::LogMessage::operator<<(&local_60,"Invalid symbol name: ");
    pLVar2 = internal::LogMessage::operator<<(pLVar2,(string *)value_local);
    internal::LogFinisher::operator=((LogFinisher *)((long)&iter._M_node + 3),pLVar2);
    internal::LogMessage::~LogMessage(&local_60);
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool SimpleDescriptorDatabase::DescriptorIndex<Value>::AddSymbol(
    const string& name, Value value) {
  // We need to make sure not to violate our map invariant.

  // If the symbol name is invalid it could break our lookup algorithm (which
  // relies on the fact that '.' sorts before all other characters that are
  // valid in symbol names).
  if (!ValidateSymbolName(name)) {
    GOOGLE_LOG(ERROR) << "Invalid symbol name: " << name;
    return false;
  }

  // Try to look up the symbol to make sure a super-symbol doesn't already
  // exist.
  typename std::map<string, Value>::iterator iter = FindLastLessOrEqual(name);

  if (iter == by_symbol_.end()) {
    // Apparently the map is currently empty.  Just insert and be done with it.
    by_symbol_.insert(
        typename std::map<string, Value>::value_type(name, value));
    return true;
  }

  if (IsSubSymbol(iter->first, name)) {
    GOOGLE_LOG(ERROR) << "Symbol name \"" << name << "\" conflicts with the existing "
                  "symbol \"" << iter->first << "\".";
    return false;
  }

  // OK, that worked.  Now we have to make sure that no symbol in the map is
  // a sub-symbol of the one we are inserting.  The only symbol which could
  // be so is the first symbol that is greater than the new symbol.  Since
  // |iter| points at the last symbol that is less than or equal, we just have
  // to increment it.
  ++iter;

  if (iter != by_symbol_.end() && IsSubSymbol(name, iter->first)) {
    GOOGLE_LOG(ERROR) << "Symbol name \"" << name << "\" conflicts with the existing "
                  "symbol \"" << iter->first << "\".";
    return false;
  }

  // OK, no conflicts.

  // Insert the new symbol using the iterator as a hint, the new entry will
  // appear immediately before the one the iterator is pointing at.
  by_symbol_.insert(iter,
                    typename std::map<string, Value>::value_type(name, value));

  return true;
}